

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void __thiscall FSlide::SlideTraverse(FSlide *this,DVector2 *start,DVector2 *end)

{
  int iVar1;
  line_t_conflict *line;
  AActor *pAVar2;
  bool bVar3;
  uint uVar4;
  intercept_t *piVar5;
  int iVar6;
  char cVar7;
  double dVar8;
  double dVar9;
  double savedz;
  FPathTraverse it;
  FLineOpening open;
  DVector2 local_110;
  FPathTraverse local_100;
  FLineOpening local_c0;
  
  local_100._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_006fe0c8;
  FPathTraverse::init(&local_100,(EVP_PKEY_CTX *)0x1);
  do {
    piVar5 = FPathTraverse::Next(&local_100);
    if (piVar5 == (intercept_t *)0x0) break;
    if (piVar5->isaline == false) {
      cVar7 = '\x02';
      Printf("PTR_SlideTraverse: not a line?");
    }
    else {
      line = (piVar5->d).line;
      uVar4 = line->flags;
      if (((uVar4 & 4) == 0) || (line->backsector == (sector_t_conflict *)0x0)) {
        pAVar2 = this->slidemo;
        iVar6 = pAVar2->Sector->PortalGroup;
        iVar1 = line->frontsector->PortalGroup;
        dVar8 = 0.0;
        dVar9 = 0.0;
        if (iVar6 != iVar1) {
          iVar6 = iVar1 * Displacements.size + iVar6;
          dVar8 = Displacements.data.Array[iVar6].pos.X;
          dVar9 = Displacements.data.Array[iVar6].pos.Y;
        }
        dVar8 = dVar8 + (pAVar2->__Pos).X;
        dVar9 = dVar9 + (pAVar2->__Pos).Y;
        if (((byte)i_compatflags2 & 8) == 0) {
          uVar4 = (uint)(1.52587890625e-05 <
                        ((line->v1->p).X - dVar8) * (line->delta).Y +
                        (dVar9 - (line->v1->p).Y) * (line->delta).X);
        }
        else {
          uVar4 = P_VanillaPointOnLineSide(dVar8,dVar9,(line_t *)line);
        }
        if (uVar4 != 0) {
          cVar7 = (uVar4 == 0) * '\x02' + '\x02';
          goto LAB_0040ec41;
        }
      }
      else if ((((uVar4 & 0x8001) == 0) &&
               (((uVar4 >> 0xe & 1) == 0 || (this->slidemo->player == (player_t *)0x0)))) &&
              (((uVar4 & 2) == 0 ||
               ((((this->slidemo->flags3).Value & 0x100000) != 0 ||
                (((i_compatflags._3_1_ & 4) != 0 &&
                 (((this->slidemo->flags).Value & 0x8000000) != 0)))))))) {
        local_110.X = local_100.trace.dx * piVar5->frac + local_100.trace.x;
        local_110.Y = piVar5->frac * local_100.trace.dy + local_100.trace.y;
        P_LineOpening(&local_c0,this->slidemo,(line_t *)line,&local_110,(DVector2 *)0x0,0);
        pAVar2 = this->slidemo;
        if ((pAVar2->Height <= local_c0.range) &&
           ((dVar8 = (pAVar2->__Pos).Z, pAVar2->Height + dVar8 <= local_c0.top &&
            (local_c0.bottom - dVar8 < pAVar2->MaxStepHeight ||
             local_c0.bottom - dVar8 == pAVar2->MaxStepHeight)))) {
          cVar7 = '\x02';
          if (dVar8 < local_c0.bottom) {
            (pAVar2->__Pos).Z = local_c0.bottom;
            bVar3 = P_TestMobjZ(pAVar2,true,(AActor **)0x0);
            (this->slidemo->__Pos).Z = dVar8;
            if (!bVar3) goto LAB_0040ec17;
          }
          goto LAB_0040ec41;
        }
      }
LAB_0040ec17:
      dVar8 = piVar5->frac;
      cVar7 = '\x01';
      if (dVar8 < this->bestSlidefrac) {
        this->secondSlidefrac = this->bestSlidefrac;
        this->secondslideline = this->bestslideline;
        this->bestSlidefrac = dVar8;
        this->bestslideline = (line_t *)line;
      }
    }
LAB_0040ec41:
  } while (cVar7 == '\x02');
  FPathTraverse::~FPathTraverse(&local_100);
  return;
}

Assistant:

void FSlide::SlideTraverse(const DVector2 &start, const DVector2 &end)
{
	FLineOpening open;
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES);
	intercept_t *in;

	while ((in = it.Next()))
	{
		line_t* 	li;

		if (!in->isaline)
		{
			// should never happen
			Printf("PTR_SlideTraverse: not a line?");
			continue;
		}

		li = in->d.line;

		if (!(li->flags & ML_TWOSIDED) || !li->backsector)
		{
			DVector3 pos = slidemo->PosRelative(li);
			if (P_PointOnLineSide(pos, li))
			{
				// don't hit the back side
				continue;
			}
			goto isblocking;
		}
		if (li->flags & (ML_BLOCKING | ML_BLOCKEVERYTHING))
		{
			goto isblocking;
		}
		if (li->flags & ML_BLOCK_PLAYERS && slidemo->player != NULL)
		{
			goto isblocking;
		}
		if (li->flags & ML_BLOCKMONSTERS && !((slidemo->flags3 & MF3_NOBLOCKMONST)
			|| ((i_compatflags & COMPATF_NOBLOCKFRIENDS) && (slidemo->flags & MF_FRIENDLY))))
		{
			goto isblocking;
		}

		// set openrange, opentop, openbottom
		P_LineOpening(open, slidemo, li, it.InterceptPoint(in));

		if (open.range < slidemo->Height)
			goto isblocking;				// doesn't fit

		if (open.top < slidemo->Top())
			goto isblocking;				// mobj is too high

		if (open.bottom - slidemo->Z() > slidemo->MaxStepHeight)
		{
			goto isblocking;				// too big a step up
		}
		else if (slidemo->Z() < open.bottom)
		{ // [RH] Check to make sure there's nothing in the way for the step up
			double savedz = slidemo->Z();
			slidemo->SetZ(open.bottom);
			bool good = P_TestMobjZ(slidemo);
			slidemo->SetZ(savedz);
			if (!good)
			{
				goto isblocking;
			}
		}

		// this line doesn't block movement
		continue;

		// the line does block movement,
		// see if it is closer than best so far
	isblocking:
		if (in->frac < bestSlidefrac)
		{
			secondSlidefrac = bestSlidefrac;
			secondslideline = bestslideline;
			bestSlidefrac = in->frac;
			bestslideline = li;
		}

		return;		// stop
	}
}